

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O3

int __thiscall
dynamicgraph::
Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::access
          (Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,char *__name,int __type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Mutex *ppiVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined4 in_register_00000014;
  
  if (this->signalType - REFERENCE < 2) {
    pbVar4 = &this->Tcopy2;
    if (this->Tcopy != &this->Tcopy1) {
      pbVar4 = &this->Tcopy1;
    }
    ppiVar2 = this->providerMutex;
    this->copyInit = true;
    (this->super_SignalBase<int>).signalTime = *(int *)__name;
    if (ppiVar2 == (Mutex *)0x0) {
      std::__cxx11::string::_M_assign((string *)pbVar4);
    }
    else {
      std::__cxx11::string::_M_assign((string *)pbVar4);
    }
    this->copyInit = true;
  }
  else {
    if (this->signalType != FUNCTION) {
      if ((this->super_SignalBase<int>).ready == true) {
        (this->super_SignalBase<int>).ready = false;
        (*(this->super_SignalBase<int>)._vptr_SignalBase[3])
                  (this,__name,CONCAT44(in_register_00000014,__type));
      }
      iVar3 = (*(this->super_SignalBase<int>)._vptr_SignalBase[0x1d])(this);
      return iVar3;
    }
    pbVar1 = &this->Tcopy1;
    pbVar4 = pbVar1;
    if (this->Tcopy == pbVar1) {
      pbVar4 = &this->Tcopy2;
    }
    ppiVar2 = this->providerMutex;
    iVar3 = *(int *)__name;
    (this->super_SignalBase<int>).signalTime = iVar3;
    if (ppiVar2 == (Mutex *)0x0) {
      boost::
      function2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int>
      ::operator()(&this->Tfunction,pbVar4,iVar3);
    }
    else {
      boost::
      function2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int>
      ::operator()(&this->Tfunction,pbVar4,iVar3);
    }
    this->copyInit = true;
    pbVar4 = &this->Tcopy2;
    if (this->Tcopy != pbVar1) {
      pbVar4 = pbVar1;
    }
  }
  this->Tcopy = pbVar4;
  return (int)pbVar4;
}

Assistant:

const T &Signal<T, Time>::access(const Time &t) {
  switch (signalType) {
    case REFERENCE:
    case REFERENCE_NON_CONST: {
      if (NULL == providerMutex) {
        copyInit = true;
        signalTime = t;
        return setTcopy(*Treference);
      } else {
        try {
#ifdef HAVE_LIBBOOST_THREAD
          boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
          copyInit = true;
          signalTime = t;
          return setTcopy(*Treference);
        } catch (const MutexError &) {
          return accessCopy();
        }
      }

      break;
    }

    case FUNCTION: {
      if (NULL == providerMutex) {
        signalTime = t;
        Tfunction(getTwork(), t);
        copyInit = true;
        return switchTcopy();
      } else {
        try {
#ifdef HAVE_LIBBOOST_THREAD
          boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
          signalTime = t;
          Tfunction(getTwork(), t);
          copyInit = true;
          return switchTcopy();
        } catch (const MutexError &) {
          return accessCopy();
        }
      }
      break;
    }
    case CONSTANT:
    default:
      if (this->getReady()) {
        setReady(false);
        this->setTime(t);
      }
      return accessCopy();
  };
}